

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

void stbtt_GetGlyphHMetrics
               (stbtt_fontinfo *info,int glyph_index,int *advanceWidth,int *leftSideBearing)

{
  stbtt_uint16 sVar1;
  stbtt_int16 sVar2;
  int *in_RCX;
  int *in_RDX;
  int in_ESI;
  long in_RDI;
  stbtt_uint16 numOfLongHorMetrics;
  
  sVar1 = ttUSHORT((stbtt_uint8 *)(*(long *)(in_RDI + 8) + (long)*(int *)(in_RDI + 0x24) + 0x22));
  if (in_ESI < (int)(uint)sVar1) {
    if (in_RDX != (int *)0x0) {
      sVar2 = ttSHORT((stbtt_uint8 *)
                      (*(long *)(in_RDI + 8) + (long)*(int *)(in_RDI + 0x28) + (long)(in_ESI << 2)))
      ;
      *in_RDX = (int)sVar2;
    }
    if (in_RCX != (int *)0x0) {
      sVar2 = ttSHORT((stbtt_uint8 *)
                      (*(long *)(in_RDI + 8) + (long)*(int *)(in_RDI + 0x28) + (long)(in_ESI << 2) +
                      2));
      *in_RCX = (int)sVar2;
    }
  }
  else {
    if (in_RDX != (int *)0x0) {
      sVar2 = ttSHORT((stbtt_uint8 *)
                      (*(long *)(in_RDI + 8) + (long)*(int *)(in_RDI + 0x28) +
                      (long)(int)((sVar1 - 1) * 4)));
      *in_RDX = (int)sVar2;
    }
    if (in_RCX != (int *)0x0) {
      sVar2 = ttSHORT((stbtt_uint8 *)
                      (*(long *)(in_RDI + 8) + (long)*(int *)(in_RDI + 0x28) +
                       (long)(int)((uint)sVar1 << 2) + (long)(int)((in_ESI - (uint)sVar1) * 2)));
      *in_RCX = (int)sVar2;
    }
  }
  return;
}

Assistant:

STBTT_DEF void stbtt_GetGlyphHMetrics(const stbtt_fontinfo *info, int glyph_index, int *advanceWidth, int *leftSideBearing)
{
   stbtt_uint16 numOfLongHorMetrics = ttUSHORT(info->data+info->hhea + 34);
   if (glyph_index < numOfLongHorMetrics) {
      if (advanceWidth)     *advanceWidth    = ttSHORT(info->data + info->hmtx + 4*glyph_index);
      if (leftSideBearing)  *leftSideBearing = ttSHORT(info->data + info->hmtx + 4*glyph_index + 2);
   } else {
      if (advanceWidth)     *advanceWidth    = ttSHORT(info->data + info->hmtx + 4*(numOfLongHorMetrics-1));
      if (leftSideBearing)  *leftSideBearing = ttSHORT(info->data + info->hmtx + 4*numOfLongHorMetrics + 2*(glyph_index - numOfLongHorMetrics));
   }
}